

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

ChMatrix33<double> * __thiscall
chrono::fea::ChElementBeamANCF_3243::GetGreenLagrangeStrain
          (ChMatrix33<double> *__return_storage_ptr__,ChElementBeamANCF_3243 *this,double xi,
          double eta,double zeta)

{
  undefined8 uVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Matrix3xN *pMVar7;
  long lVar8;
  double *Sxi_D_00;
  undefined1 auVar9 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  double dVar18;
  double dVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ChMatrix33<double> I3x3;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> J_0xi;
  MatrixNx3c Sxi_D;
  Matrix3xN e_bar;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  double local_2e0 [2];
  double *local_2d0;
  SrcXprType local_2c8 [6];
  double adStack_298 [2];
  Matrix<double,_3,_3,_1,_3,_3> local_288;
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
  local_180 [16];
  undefined8 local_170;
  double **local_168;
  double **local_160;
  undefined8 *local_158;
  undefined1 local_140 [16];
  double dStack_130;
  double dStack_128;
  double dStack_120;
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  double *pdStack_f0;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_e8;
  double dStack_e0;
  undefined1 auStack_d8 [24];
  undefined1 local_c0 [64];
  
  Sxi_D_00 = (double *)local_240;
  Calc_Sxi_D(this,(MatrixNx3c *)Sxi_D_00,xi,eta,zeta);
  pMVar7 = &this->m_ebar0;
  lVar8 = 0x10;
  do {
    auVar14 = *(undefined1 (*) [64])
               (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
               m_data.array;
    pMVar7 = (Matrix3xN *)
             ((pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
              m_data.array + 8);
    auVar12 = vmulpd_avx512f(auVar14,local_240);
    auVar9 = vextractf64x4_avx512f(auVar12,1);
    auVar13 = vmulpd_avx512f(auVar14,local_200);
    auVar14 = vmulpd_avx512f(auVar14,local_1c0);
    auVar10 = vextractf64x4_avx512f(auVar13,1);
    auVar11 = vextractf64x4_avx512f(auVar14,1);
    *(double *)((long)adStack_298 + lVar8) =
         auVar12._0_8_ + auVar9._0_8_ + auVar12._8_8_ + auVar9._8_8_ +
         auVar12._16_8_ + auVar9._16_8_ + auVar12._24_8_ + auVar9._24_8_;
    *(double *)((long)adStack_298 + lVar8 + 8) =
         auVar13._0_8_ + auVar10._0_8_ + auVar13._8_8_ + auVar10._8_8_ +
         auVar13._16_8_ + auVar10._16_8_ + auVar13._24_8_ + auVar10._24_8_;
    dVar18 = auVar14._0_8_ + auVar11._0_8_ + auVar14._8_8_ + auVar11._8_8_;
    dVar21 = auVar14._16_8_ + auVar11._16_8_ + auVar14._24_8_ + auVar11._24_8_;
    auVar19._0_8_ = dVar18 + dVar21;
    auVar19._8_8_ = dVar18 + dVar21;
    uVar1 = vmovlpd_avx(auVar19);
    *(undefined8 *)
     ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + lVar8) = uVar1;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x58);
  local_2c8[0].m_xpr = &local_288;
  local_2d0 = Sxi_D_00;
  local_140._0_8_ = Sxi_D_00;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_140 + 8),local_2c8,
        (assign_op<double,_double> *)&local_318);
  pdStack_f0 = (double *)local_140._0_8_;
  dStack_e0 = 1.48219693752374e-323;
  auVar14 = *(undefined1 (*) [64])local_140._0_8_;
  auVar12 = *(undefined1 (*) [64])(local_140._0_8_ + 0x40);
  auVar13 = *(undefined1 (*) [64])(local_140._0_8_ + 0x80);
  auVar15._8_8_ = local_140._8_8_;
  auVar15._0_8_ = local_140._8_8_;
  auVar15._16_8_ = local_140._8_8_;
  auVar15._24_8_ = local_140._8_8_;
  auVar15._32_8_ = local_140._8_8_;
  auVar15._40_8_ = local_140._8_8_;
  auVar15._48_8_ = local_140._8_8_;
  auVar15._56_8_ = local_140._8_8_;
  auVar15 = vmulpd_avx512f(auVar14,auVar15);
  auVar16._8_8_ = dStack_130;
  auVar16._0_8_ = dStack_130;
  auVar16._16_8_ = dStack_130;
  auVar16._24_8_ = dStack_130;
  auVar16._32_8_ = dStack_130;
  auVar16._40_8_ = dStack_130;
  auVar16._48_8_ = dStack_130;
  auVar16._56_8_ = dStack_130;
  auVar16 = vmulpd_avx512f(auVar14,auVar16);
  auVar17._8_8_ = dStack_128;
  auVar17._0_8_ = dStack_128;
  auVar17._16_8_ = dStack_128;
  auVar17._24_8_ = dStack_128;
  auVar17._32_8_ = dStack_128;
  auVar17._40_8_ = dStack_128;
  auVar17._48_8_ = dStack_128;
  auVar17._56_8_ = dStack_128;
  auVar17 = vmulpd_avx512f(auVar14,auVar17);
  auVar14._8_8_ = dStack_120;
  auVar14._0_8_ = dStack_120;
  auVar14._16_8_ = dStack_120;
  auVar14._24_8_ = dStack_120;
  auVar14._32_8_ = dStack_120;
  auVar14._40_8_ = dStack_120;
  auVar14._48_8_ = dStack_120;
  auVar14._56_8_ = dStack_120;
  auVar14 = vfmadd231pd_avx512f(auVar15,auVar12,auVar14);
  auVar2._8_8_ = dStack_118;
  auVar2._0_8_ = dStack_118;
  auVar2._16_8_ = dStack_118;
  auVar2._24_8_ = dStack_118;
  auVar2._32_8_ = dStack_118;
  auVar2._40_8_ = dStack_118;
  auVar2._48_8_ = dStack_118;
  auVar2._56_8_ = dStack_118;
  auVar15 = vfmadd231pd_avx512f(auVar16,auVar12,auVar2);
  auVar3._8_8_ = dStack_110;
  auVar3._0_8_ = dStack_110;
  auVar3._16_8_ = dStack_110;
  auVar3._24_8_ = dStack_110;
  auVar3._32_8_ = dStack_110;
  auVar3._40_8_ = dStack_110;
  auVar3._48_8_ = dStack_110;
  auVar3._56_8_ = dStack_110;
  auVar16 = vfmadd231pd_avx512f(auVar17,auVar12,auVar3);
  auVar12._8_8_ = dStack_108;
  auVar12._0_8_ = dStack_108;
  auVar12._16_8_ = dStack_108;
  auVar12._24_8_ = dStack_108;
  auVar12._32_8_ = dStack_108;
  auVar12._40_8_ = dStack_108;
  auVar12._48_8_ = dStack_108;
  auVar12._56_8_ = dStack_108;
  local_240 = vfmadd231pd_avx512f(auVar14,auVar13,auVar12);
  auVar4._8_8_ = local_100;
  auVar4._0_8_ = local_100;
  auVar4._16_8_ = local_100;
  auVar4._24_8_ = local_100;
  auVar4._32_8_ = local_100;
  auVar4._40_8_ = local_100;
  auVar4._48_8_ = local_100;
  auVar4._56_8_ = local_100;
  local_200 = vfmadd231pd_avx512f(auVar15,auVar13,auVar4);
  auVar5._8_8_ = dStack_f8;
  auVar5._0_8_ = dStack_f8;
  auVar5._16_8_ = dStack_f8;
  auVar5._24_8_ = dStack_f8;
  auVar5._32_8_ = dStack_f8;
  auVar5._40_8_ = dStack_f8;
  auVar5._48_8_ = dStack_f8;
  auVar5._56_8_ = dStack_f8;
  local_1c0 = vfmadd231pd_avx512f(auVar16,auVar13,auVar5);
  pMStack_e8 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_140 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_140);
  auVar13._8_8_ = local_140._8_8_;
  auVar13._0_8_ = local_140._0_8_;
  auVar13._16_8_ = dStack_130;
  auVar13._24_8_ = dStack_128;
  auVar13._32_8_ = dStack_120;
  auVar13._40_8_ = dStack_118;
  auVar13._48_8_ = dStack_110;
  auVar13._56_8_ = dStack_108;
  auVar6._8_8_ = dStack_f8;
  auVar6._0_8_ = local_100;
  auVar6._16_8_ = pdStack_f0;
  auVar6._24_8_ = pMStack_e8;
  auVar6._32_8_ = dStack_e0;
  auVar6._40_24_ = auStack_d8;
  lVar8 = 0x10;
  do {
    auVar14 = *(undefined1 (*) [64])Sxi_D_00;
    Sxi_D_00 = Sxi_D_00 + 8;
    auVar12 = vmulpd_avx512f(auVar13,auVar14);
    auVar9 = vextractf64x4_avx512f(auVar12,1);
    auVar15 = vmulpd_avx512f(auVar14,auVar6);
    auVar14 = vmulpd_avx512f(auVar14,local_c0);
    auVar10 = vextractf64x4_avx512f(auVar15,1);
    auVar11 = vextractf64x4_avx512f(auVar14,1);
    *(double *)((long)local_2e0 + lVar8) =
         auVar12._0_8_ + auVar9._0_8_ + auVar12._8_8_ + auVar9._8_8_ +
         auVar12._16_8_ + auVar9._16_8_ + auVar12._24_8_ + auVar9._24_8_;
    *(double *)((long)local_2e0 + lVar8 + 8) =
         auVar15._0_8_ + auVar10._0_8_ + auVar15._8_8_ + auVar10._8_8_ +
         auVar15._16_8_ + auVar10._16_8_ + auVar15._24_8_ + auVar10._24_8_;
    dVar18 = auVar14._0_8_ + auVar11._0_8_ + auVar14._8_8_ + auVar11._8_8_;
    dVar21 = auVar14._16_8_ + auVar11._16_8_ + auVar14._24_8_ + auVar11._24_8_;
    auVar20._0_8_ = dVar18 + dVar21;
    auVar20._8_8_ = dVar18 + dVar21;
    uVar1 = vmovlpd_avx(auVar20);
    *(undefined8 *)((long)&local_2c8[-1].m_xpr + lVar8) = uVar1;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x58);
  local_168 = &local_2d0;
  local_318 = 0x3ff0000000000000;
  local_310 = 0;
  uStack_308 = 0;
  local_300 = 0;
  local_2f8 = 0x3ff0000000000000;
  local_2e0[0] = 0.0;
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_2e0[1] = 1.0;
  local_170 = 0x3fe0000000000000;
  local_158 = &local_318;
  local_160 = local_168;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (__return_storage_ptr__,local_180);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementBeamANCF_3243::GetGreenLagrangeStrain(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    ChMatrix33<> I3x3;
    I3x3.setIdentity();
    return 0.5 * (F.transpose() * F - I3x3);
}